

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAxisSweep3.h
# Opt level: O3

void __thiscall
btAxisSweep3Internal<unsigned_short>::calculateOverlappingPairs
          (btAxisSweep3Internal<unsigned_short> *this,btDispatcher *dispatcher)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  int iVar3;
  btBroadphasePair *pbVar4;
  btBroadphaseProxy *pbVar5;
  btBroadphaseProxy *pbVar6;
  undefined8 uVar7;
  btAxisSweep3Internal<unsigned_short> *pbVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  btAlignedObjectArray<btBroadphasePair> *this_00;
  btBroadphasePair *pbVar12;
  long lVar13;
  ulong uVar14;
  Handle *pHandleB;
  btBroadphaseProxy *pbVar15;
  Handle *pHandleA;
  btBroadphaseProxy *pbVar16;
  int iVar17;
  long lVar18;
  int iVar19;
  int curSize;
  uint uVar20;
  btBroadphasePairSortPredicate local_42;
  btBroadphasePairSortPredicate local_41;
  btAxisSweep3Internal<unsigned_short> *local_40;
  btDispatcher *local_38;
  undefined4 extraout_var;
  
  local_38 = dispatcher;
  iVar10 = (*(this->m_pairCache->super_btOverlappingPairCallback)._vptr_btOverlappingPairCallback
             [0xe])();
  if ((char)iVar10 != '\0') {
    iVar10 = (*(this->m_pairCache->super_btOverlappingPairCallback)._vptr_btOverlappingPairCallback
               [7])();
    this_00 = (btAlignedObjectArray<btBroadphasePair> *)CONCAT44(extraout_var,iVar10);
    uVar20 = this_00->m_size;
    if (1 < (int)uVar20) {
      btAlignedObjectArray<btBroadphasePair>::quickSortInternal<btBroadphasePairSortPredicate>
                (this_00,&local_41,0,uVar20 - 1);
      uVar20 = this_00->m_size;
    }
    lVar18 = (long)this->m_invalidPair;
    iVar10 = uVar20 - this->m_invalidPair;
    if (lVar18 < 0) {
      if (this_00->m_capacity < iVar10) {
        if (iVar10 == 0) {
          pbVar12 = (btBroadphasePair *)0x0;
          uVar11 = uVar20;
        }
        else {
          pbVar12 = (btBroadphasePair *)btAlignedAllocInternal((long)iVar10 << 5,0x10);
          uVar11 = this_00->m_size;
        }
        if (0 < (int)uVar11) {
          lVar13 = 0;
          do {
            pbVar4 = this_00->m_data;
            puVar1 = (undefined8 *)((long)&pbVar4->m_pProxy0 + lVar13);
            uVar7 = puVar1[1];
            puVar2 = (undefined8 *)((long)&pbVar12->m_pProxy0 + lVar13);
            *puVar2 = *puVar1;
            puVar2[1] = uVar7;
            *(undefined8 *)((long)&pbVar12->m_algorithm + lVar13) =
                 *(undefined8 *)((long)&pbVar4->m_algorithm + lVar13);
            *(undefined8 *)((long)&pbVar12->field_3 + lVar13) =
                 *(undefined8 *)((long)&pbVar4->field_3 + lVar13);
            lVar13 = lVar13 + 0x20;
          } while ((ulong)uVar11 << 5 != lVar13);
        }
        if ((this_00->m_data != (btBroadphasePair *)0x0) && (this_00->m_ownsMemory == true)) {
          btAlignedFreeInternal(this_00->m_data);
        }
        this_00->m_ownsMemory = true;
        this_00->m_data = pbVar12;
        this_00->m_capacity = iVar10;
      }
      lVar13 = (long)(int)uVar20 << 5;
      do {
        pbVar12 = this_00->m_data;
        puVar1 = (undefined8 *)((long)&pbVar12->m_algorithm + lVar13);
        *puVar1 = 0;
        puVar1[1] = 0;
        puVar1 = (undefined8 *)((long)&pbVar12->m_pProxy0 + lVar13);
        *puVar1 = 0;
        puVar1[1] = 0;
        lVar13 = lVar13 + 0x20;
        lVar18 = lVar18 + 1;
      } while (lVar18 != 0);
    }
    this_00->m_size = iVar10;
    this->m_invalidPair = 0;
    if (0 < iVar10) {
      iVar17 = 0;
      lVar18 = 0;
      pbVar15 = (btBroadphaseProxy *)0x0;
      pbVar16 = (btBroadphaseProxy *)0x0;
      local_40 = this;
      do {
        pbVar8 = local_40;
        pbVar12 = this_00->m_data;
        pbVar5 = pbVar12[lVar18].m_pProxy0;
        pbVar6 = pbVar12[lVar18].m_pProxy1;
        if (((pbVar15 == pbVar6 && pbVar16 == pbVar5) ||
            (*(ushort *)((long)&pbVar5[1].m_clientObject + 2) < *(ushort *)&pbVar6->field_0x3c)) ||
           (*(ushort *)((long)&pbVar6[1].m_clientObject + 2) < *(ushort *)&pbVar5->field_0x3c)) {
LAB_00130d41:
          pbVar12 = pbVar12 + lVar18;
          (*(local_40->m_pairCache->super_btOverlappingPairCallback)._vptr_btOverlappingPairCallback
            [8])(local_40->m_pairCache,pbVar12,local_38);
          pbVar12->m_pProxy0 = (btBroadphaseProxy *)0x0;
          pbVar12->m_pProxy1 = (btBroadphaseProxy *)0x0;
          iVar17 = pbVar8->m_invalidPair + 1;
          pbVar8->m_invalidPair = iVar17;
          gOverlappingPairs = gOverlappingPairs + -1;
          iVar10 = this_00->m_size;
        }
        else {
          uVar9 = 0;
          do {
            uVar14 = uVar9;
            if ((uVar14 == 2) ||
               (*(ushort *)((long)pbVar5[1].m_aabbMin.m_floats + uVar14 * 2 + -0x18) <
                *(ushort *)((long)(&pbVar6->m_aabbMax + 1) + uVar14 * 2 + 2))) break;
            uVar9 = uVar14 + 1;
          } while (*(ushort *)((long)(&pbVar5->m_aabbMax + 1) + uVar14 * 2 + 2) <=
                   *(ushort *)((long)pbVar6[1].m_aabbMin.m_floats + uVar14 * 2 + -0x18));
          if (uVar14 < 2) goto LAB_00130d41;
        }
        lVar18 = lVar18 + 1;
        pbVar15 = pbVar6;
        pbVar16 = pbVar5;
      } while (lVar18 < iVar10);
      iVar19 = iVar10;
      if (1 < iVar10) {
        btAlignedObjectArray<btBroadphasePair>::quickSortInternal<btBroadphasePairSortPredicate>
                  (this_00,&local_42,0,iVar10 + -1);
        iVar17 = local_40->m_invalidPair;
        iVar19 = this_00->m_size;
      }
      this = local_40;
      iVar10 = iVar19 - iVar17;
      if (iVar17 < 0) {
        if (this_00->m_capacity < iVar10) {
          if (iVar19 == iVar17) {
            pbVar12 = (btBroadphasePair *)0x0;
          }
          else {
            pbVar12 = (btBroadphasePair *)btAlignedAllocInternal((long)iVar10 << 5,0x10);
            iVar3 = this_00->m_size;
            if (0 < (long)iVar3) {
              lVar18 = 0;
              do {
                pbVar4 = this_00->m_data;
                puVar1 = (undefined8 *)((long)&pbVar4->m_pProxy0 + lVar18);
                uVar7 = puVar1[1];
                puVar2 = (undefined8 *)((long)&pbVar12->m_pProxy0 + lVar18);
                *puVar2 = *puVar1;
                puVar2[1] = uVar7;
                *(undefined8 *)((long)&pbVar12->m_algorithm + lVar18) =
                     *(undefined8 *)((long)&pbVar4->m_algorithm + lVar18);
                *(undefined8 *)((long)&pbVar12->field_3 + lVar18) =
                     *(undefined8 *)((long)&pbVar4->field_3 + lVar18);
                lVar18 = lVar18 + 0x20;
              } while ((long)iVar3 * 0x20 != lVar18);
            }
          }
          if ((this_00->m_data != (btBroadphasePair *)0x0) && (this_00->m_ownsMemory == true)) {
            btAlignedFreeInternal(this_00->m_data);
          }
          this_00->m_ownsMemory = true;
          this_00->m_data = pbVar12;
          this_00->m_capacity = iVar10;
        }
        lVar13 = (long)iVar17;
        lVar18 = (long)iVar19 << 5;
        do {
          pbVar12 = this_00->m_data;
          puVar1 = (undefined8 *)((long)&pbVar12->m_algorithm + lVar18);
          *puVar1 = 0;
          puVar1[1] = 0;
          puVar1 = (undefined8 *)((long)&pbVar12->m_pProxy0 + lVar18);
          *puVar1 = 0;
          puVar1[1] = 0;
          lVar18 = lVar18 + 0x20;
          lVar13 = lVar13 + 1;
        } while (lVar13 != 0);
      }
    }
    this_00->m_size = iVar10;
    this->m_invalidPair = 0;
  }
  return;
}

Assistant:

void	btAxisSweep3Internal<BP_FP_INT_TYPE>::calculateOverlappingPairs(btDispatcher* dispatcher)
{

	if (m_pairCache->hasDeferredRemoval())
	{
	
		btBroadphasePairArray&	overlappingPairArray = m_pairCache->getOverlappingPairArray();

		//perform a sort, to find duplicates and to sort 'invalid' pairs to the end
		overlappingPairArray.quickSort(btBroadphasePairSortPredicate());

		overlappingPairArray.resize(overlappingPairArray.size() - m_invalidPair);
		m_invalidPair = 0;

		
		int i;

		btBroadphasePair previousPair;
		previousPair.m_pProxy0 = 0;
		previousPair.m_pProxy1 = 0;
		previousPair.m_algorithm = 0;
		
		
		for (i=0;i<overlappingPairArray.size();i++)
		{
		
			btBroadphasePair& pair = overlappingPairArray[i];

			bool isDuplicate = (pair == previousPair);

			previousPair = pair;

			bool needsRemoval = false;

			if (!isDuplicate)
			{
				///important to use an AABB test that is consistent with the broadphase
				bool hasOverlap = testAabbOverlap(pair.m_pProxy0,pair.m_pProxy1);

				if (hasOverlap)
				{
					needsRemoval = false;//callback->processOverlap(pair);
				} else
				{
					needsRemoval = true;
				}
			} else
			{
				//remove duplicate
				needsRemoval = true;
				//should have no algorithm
				btAssert(!pair.m_algorithm);
			}
			
			if (needsRemoval)
			{
				m_pairCache->cleanOverlappingPair(pair,dispatcher);

		//		m_overlappingPairArray.swap(i,m_overlappingPairArray.size()-1);
		//		m_overlappingPairArray.pop_back();
				pair.m_pProxy0 = 0;
				pair.m_pProxy1 = 0;
				m_invalidPair++;
				gOverlappingPairs--;
			} 
			
		}

	///if you don't like to skip the invalid pairs in the array, execute following code:
	#define CLEAN_INVALID_PAIRS 1
	#ifdef CLEAN_INVALID_PAIRS

		//perform a sort, to sort 'invalid' pairs to the end
		overlappingPairArray.quickSort(btBroadphasePairSortPredicate());

		overlappingPairArray.resize(overlappingPairArray.size() - m_invalidPair);
		m_invalidPair = 0;
	#endif//CLEAN_INVALID_PAIRS
		
		//printf("overlappingPairArray.size()=%d\n",overlappingPairArray.size());
	}

}